

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureGatherTests.cpp
# Opt level: O1

int __thiscall
deqp::gles31::Functional::anon_unknown_0::TextureGatherCase::init
          (TextureGatherCase *this,EVP_PKEY_CTX *ctx)

{
  MovePtr<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
  *this_00;
  MovePtr<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
  *this_01;
  ostringstream *this_02;
  ChannelOrder CVar1;
  TestLog *this_03;
  RenderContext *pRVar2;
  code *pcVar3;
  bool bVar4;
  int iVar5;
  ContextType ctxType;
  deUint32 dVar6;
  undefined4 extraout_var;
  ObjectWrapper *pOVar7;
  undefined4 extraout_var_00;
  ObjectTraits *pOVar8;
  undefined4 extraout_var_01;
  char *pcVar9;
  size_t sVar10;
  ulong uVar11;
  NotSupportedError *this_04;
  TestError *pTVar12;
  undefined4 uVar13;
  long lVar14;
  undefined4 uVar15;
  long lVar16;
  IVec2 offsetRange;
  undefined1 local_6b8 [8];
  undefined1 local_6b0 [32];
  string local_690;
  string local_670;
  string local_650;
  undefined1 local_630 [8];
  _func_int **local_628;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_620;
  _Alloc_hider local_610;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_600;
  _Alloc_hider local_5f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_5e0;
  qpKeyValueTag local_5d0;
  ShaderProgram *local_5c8;
  ios_base local_5b8 [264];
  undefined1 local_4b0 [8];
  _func_int **local_4a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4a0;
  _Alloc_hider local_490;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_480;
  _Alloc_hider local_470;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_460;
  qpKeyValueTag local_450;
  deInt64 local_448;
  ios_base local_438 [264];
  undefined1 local_330 [8];
  _func_int **local_328;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_320 [6];
  ios_base local_2b8 [264];
  undefined1 local_1b0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0 [6];
  ios_base local_138 [264];
  
  this_03 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  pRVar2 = ((this->super_TestCase).m_context)->m_renderCtx;
  iVar5 = (*pRVar2->_vptr_RenderContext[3])(pRVar2);
  lVar14 = CONCAT44(extraout_var,iVar5);
  uVar15 = 0xffffffff;
  if ((ulong)this->m_textureType < 3) {
    uVar15 = *(undefined4 *)(&DAT_01cc1bc8 + (ulong)this->m_textureType * 4);
  }
  ctxType.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  bVar4 = glu::contextSupports(ctxType,(ApiType)0x23);
  if ((!bVar4) && ((this->m_gatherType & ~GATHERTYPE_OFFSET) == GATHERTYPE_OFFSET_DYNAMIC)) {
    bVar4 = glu::ContextInfo::isExtensionSupported
                      (((this->super_TestCase).m_context)->m_contextInfo,"GL_EXT_gpu_shader5");
    if (!bVar4) {
      this_04 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      local_630 = (undefined1  [8])&local_620;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_630,"GL_EXT_gpu_shader5 required","");
      tcu::NotSupportedError::NotSupportedError(this_04,(string *)local_630);
      __cxa_throw(this_04,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
  }
  if (this->m_offsetSize == OFFSETSIZE_IMPLEMENTATION_MAXIMUM) {
    getOffsetRange((TextureGatherCase *)local_6b8);
    local_330 = (undefined1  [8])local_320;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_330,"ImplementationMinTextureGatherOffset","");
    local_1b0._0_8_ = local_1a0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1b0,
               "Implementation\'s value for GL_MIN_PROGRAM_TEXTURE_GATHER_OFFSET","");
    local_670._M_dataplus._M_p = (pointer)&local_670.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_670,0x1b32ab9);
    tcu::LogNumber<long>::LogNumber
              ((LogNumber<long> *)local_630,(string *)local_330,(string *)local_1b0,&local_670,
               QP_KEY_TAG_NONE,(long)(int)local_6b8._0_4_);
    tcu::TestLog::writeInteger
              (this_03,(char *)local_630,local_610._M_p,local_5f0._M_p,local_5d0,(deInt64)local_5c8)
    ;
    local_690._M_dataplus._M_p = (pointer)&local_690.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_690,"ImplementationMaxTextureGatherOffset","");
    local_6b0._0_8_ = local_6b0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_6b0,
               "Implementation\'s value for GL_MAX_PROGRAM_TEXTURE_GATHER_OFFSET","");
    local_650._M_dataplus._M_p = (pointer)&local_650.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_650,0x1b32ab9);
    tcu::LogNumber<long>::LogNumber
              ((LogNumber<long> *)local_4b0,&local_690,(string *)local_6b0,&local_650,
               QP_KEY_TAG_NONE,(long)(int)local_6b8._4_4_);
    tcu::TestLog::writeInteger
              (this_03,(char *)local_4b0,local_490._M_p,local_470._M_p,local_450,local_448);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_470._M_p != &local_460) {
      operator_delete(local_470._M_p,local_460._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_490._M_p != &local_480) {
      operator_delete(local_490._M_p,local_480._M_allocated_capacity + 1);
    }
    if (local_4b0 != (undefined1  [8])&local_4a0) {
      operator_delete((void *)local_4b0,local_4a0._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_650._M_dataplus._M_p != &local_650.field_2) {
      operator_delete(local_650._M_dataplus._M_p,local_650.field_2._M_allocated_capacity + 1);
    }
    if ((TestContext *)local_6b0._0_8_ != (TestContext *)(local_6b0 + 0x10)) {
      operator_delete((void *)local_6b0._0_8_,local_6b0._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_690._M_dataplus._M_p != &local_690.field_2) {
      operator_delete(local_690._M_dataplus._M_p,local_690.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5f0._M_p != &local_5e0) {
      operator_delete(local_5f0._M_p,(ulong)(local_5e0._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_610._M_p != &local_600) {
      operator_delete(local_610._M_p,local_600._M_allocated_capacity + 1);
    }
    if (local_630 != (undefined1  [8])&local_620) {
      operator_delete((void *)local_630,local_620._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_670._M_dataplus._M_p != &local_670.field_2) {
      operator_delete(local_670._M_dataplus._M_p,local_670.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b0._0_8_ != local_1a0) {
      operator_delete((void *)local_1b0._0_8_,local_1a0[0]._M_allocated_capacity + 1);
    }
    if (local_330 != (undefined1  [8])local_320) {
      operator_delete((void *)local_330,local_320[0]._M_allocated_capacity + 1);
    }
    if (-8 < (int)local_6b8._0_4_) {
      pTVar12 = (TestError *)__cxa_allocate_exception(0x38);
      local_330._0_4_ = 0xfffffff8;
      de::toString<int>((string *)local_4b0,(int *)local_330);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_630,
                     "GL_MIN_PROGRAM_TEXTURE_GATHER_OFFSET must be at most ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4b0)
      ;
      tcu::TestError::TestError
                (pTVar12,(char *)local_630,"offsetRange[0] <= SPEC_MAX_MIN_OFFSET",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureGatherTests.cpp"
                 ,0x4f4);
      __cxa_throw(pTVar12,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    if ((int)local_6b8._4_4_ < 7) {
      pTVar12 = (TestError *)__cxa_allocate_exception(0x38);
      local_330._0_4_ = 7;
      de::toString<int>((string *)local_4b0,(int *)local_330);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_630,
                     "GL_MAX_PROGRAM_TEXTURE_GATHER_OFFSET must be at least ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4b0)
      ;
      tcu::TestError::TestError
                (pTVar12,(char *)local_630,"offsetRange[1] >= SPEC_MIN_MAX_OFFSET",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureGatherTests.cpp"
                 ,0x4f5);
      __cxa_throw(pTVar12,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
  }
  pOVar7 = (ObjectWrapper *)operator_new(0x18);
  iVar5 = (*pRVar2->_vptr_RenderContext[3])(pRVar2);
  pOVar8 = glu::objectTraits(OBJECTTYPE_RENDERBUFFER);
  glu::ObjectWrapper::ObjectWrapper(pOVar7,(Functions *)CONCAT44(extraout_var_00,iVar5),pOVar8);
  local_630 = (undefined1  [8])0x0;
  this_00 = &this->m_colorBuffer;
  if (&((this->m_colorBuffer).
        super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
        .m_data.ptr)->super_ObjectWrapper != pOVar7) {
    de::details::
    UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
    ::reset(&this_00->
             super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
           );
    (this_00->
    super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
    ).m_data.ptr = (TypedObjectWrapper<(glu::ObjectType)2> *)pOVar7;
  }
  de::details::
  UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
  ::reset((UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
           *)local_630);
  (**(code **)(lVar14 + 0xa0))
            (0x8d41,(((this->m_colorBuffer).
                      super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
                      .m_data.ptr)->super_ObjectWrapper).m_object);
  pcVar3 = *(code **)(lVar14 + 0x1238);
  dVar6 = glu::getInternalFormat(this->m_colorBufferFormat);
  (*pcVar3)(0x8d41,dVar6,0x40,0x40);
  dVar6 = (**(code **)(lVar14 + 0x800))();
  glu::checkError(dVar6,"Create and setup renderbuffer object",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureGatherTests.cpp"
                  ,0x4fd);
  pOVar7 = (ObjectWrapper *)operator_new(0x18);
  iVar5 = (*pRVar2->_vptr_RenderContext[3])(pRVar2);
  pOVar8 = glu::objectTraits(OBJECTTYPE_FRAMEBUFFER);
  glu::ObjectWrapper::ObjectWrapper(pOVar7,(Functions *)CONCAT44(extraout_var_01,iVar5),pOVar8);
  local_630 = (undefined1  [8])0x0;
  this_01 = &this->m_fbo;
  if (&((this->m_fbo).
        super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
        .m_data.ptr)->super_ObjectWrapper != pOVar7) {
    de::details::
    UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
    ::reset(&this_01->
             super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
           );
    (this_01->
    super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
    ).m_data.ptr = (TypedObjectWrapper<(glu::ObjectType)3> *)pOVar7;
  }
  de::details::
  UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
  ::reset((UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
           *)local_630);
  (**(code **)(lVar14 + 0x78))
            (0x8d40,(((this_01->
                      super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
                      ).m_data.ptr)->super_ObjectWrapper).m_object);
  (**(code **)(lVar14 + 0x688))
            (0x8d40,0x8ce0,0x8d41,
             (((this_00->
               super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
               ).m_data.ptr)->super_ObjectWrapper).m_object);
  dVar6 = (**(code **)(lVar14 + 0x800))();
  glu::checkError(dVar6,"Create and setup framebuffer object",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureGatherTests.cpp"
                  ,0x502);
  local_630 = (undefined1  [8])this_03;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_628);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_628,"Using a framebuffer object with renderbuffer with format ",0x39)
  ;
  dVar6 = glu::getInternalFormat(this->m_colorBufferFormat);
  pcVar9 = glu::getTextureFormatName(dVar6);
  if (pcVar9 == (char *)0x0) {
    std::ios::clear((int)(ostringstream *)&local_628 + (int)local_628[-3]);
  }
  else {
    sVar10 = strlen(pcVar9);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_628,pcVar9,sVar10);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_628," and size ",10);
  tcu::operator<<((ostream *)&local_628,
                  (Vector<int,_2> *)
                  &Functional::(anonymous_namespace)::TextureGatherCase::RENDER_SIZE);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_630,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_628);
  std::ios_base::~ios_base(local_5b8);
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])(this);
  this->m_currentIteration = 0;
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[6])(this);
  pcVar3 = *(code **)(lVar14 + 0x1360);
  dVar6 = glu::getGLWrapMode(this->m_wrapS);
  (*pcVar3)(uVar15,0x2802,dVar6);
  pcVar3 = *(code **)(lVar14 + 0x1360);
  dVar6 = glu::getGLWrapMode(this->m_wrapT);
  (*pcVar3)(uVar15,0x2803,dVar6);
  pcVar3 = *(code **)(lVar14 + 0x1360);
  dVar6 = glu::getGLFilterMode(this->m_minFilter);
  (*pcVar3)(uVar15,0x2801,dVar6);
  pcVar3 = *(code **)(lVar14 + 0x1360);
  dVar6 = glu::getGLFilterMode(this->m_magFilter);
  (*pcVar3)(uVar15,0x2800,dVar6);
  if (this->m_baseLevel != 0) {
    (**(code **)(lVar14 + 0x1360))(uVar15,0x813c);
  }
  CVar1 = (this->m_textureFormat).order;
  if ((CVar1 == DS) || (CVar1 == D)) {
    (**(code **)(lVar14 + 0x1360))(uVar15,0x884c,0x884e);
    pcVar3 = *(code **)(lVar14 + 0x1360);
    dVar6 = glu::getGLCompareFunc(this->m_shadowCompareMode);
    (*pcVar3)(uVar15,0x884d,dVar6);
  }
  if ((this->m_textureSwizzle).m_isSome == true) {
    lVar16 = 0;
    do {
      uVar11 = (ulong)*(uint *)((long)(this->m_textureSwizzle).m_swizzle.m_data + lVar16);
      uVar13 = 0xffffffff;
      if (uVar11 < 6) {
        uVar13 = *(undefined4 *)(&DAT_01cc1bd4 + uVar11 * 4);
      }
      (**(code **)(lVar14 + 0x1360))
                (uVar15,*(undefined4 *)((long)&gl3cts::TextureSwizzle::states + lVar16),uVar13);
      lVar16 = lVar16 + 4;
    } while (lVar16 != 0x10);
  }
  dVar6 = (**(code **)(lVar14 + 0x800))();
  glu::checkError(dVar6,"Set texture parameters",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureGatherTests.cpp"
                  ,0x52f);
  this_02 = (ostringstream *)(local_1b0 + 8);
  local_1b0._0_8_ = this_03;
  std::__cxx11::ostringstream::ostringstream(this_02);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_02,"Texture base level is ",0x16);
  std::ostream::operator<<(this_02,this->m_baseLevel);
  local_330 = (undefined1  [8])
              tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_328);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_328,"s and t wrap modes are ",0x17);
  dVar6 = glu::getGLWrapMode(this->m_wrapS);
  pcVar9 = glu::getTextureWrapModeName(dVar6);
  iVar5 = (int)(ostringstream *)&local_328;
  if (pcVar9 == (char *)0x0) {
    std::ios::clear(iVar5 + (int)local_328[-3]);
  }
  else {
    sVar10 = strlen(pcVar9);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_328,pcVar9,sVar10);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_328," and ",5);
  dVar6 = glu::getGLWrapMode(this->m_wrapT);
  pcVar9 = glu::getTextureWrapModeName(dVar6);
  if (pcVar9 == (char *)0x0) {
    std::ios::clear(iVar5 + (int)local_328[-3]);
  }
  else {
    sVar10 = strlen(pcVar9);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_328,pcVar9,sVar10);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_328,", respectively",0xe);
  local_4b0 = (undefined1  [8])
              tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)local_330,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_4a8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_4a8,"Minification and magnification filter modes are ",0x30);
  dVar6 = glu::getGLFilterMode(this->m_minFilter);
  pcVar9 = glu::getTextureFilterName(dVar6);
  iVar5 = (int)(ostringstream *)&local_4a8;
  if (pcVar9 == (char *)0x0) {
    std::ios::clear((int)local_4a8[-3] + iVar5);
  }
  else {
    sVar10 = strlen(pcVar9);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_4a8,pcVar9,sVar10);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_4a8," and ",5);
  dVar6 = glu::getGLFilterMode(this->m_magFilter);
  pcVar9 = glu::getTextureFilterName(dVar6);
  if (pcVar9 == (char *)0x0) {
    std::ios::clear((int)local_4a8[-3] + iVar5);
  }
  else {
    sVar10 = strlen(pcVar9);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_4a8,pcVar9,sVar10);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_4a8,", respectively ",0xf);
  bVar4 = (this->m_flags & 1) == 0;
  pcVar9 = "(note that they cause the texture to be incomplete)";
  if (bVar4) {
    pcVar9 = "(note that they should have no effect on gather result)";
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_4a8,pcVar9,(ulong)bVar4 * 4 + 0x33);
  local_630 = (undefined1  [8])
              tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)local_4b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_628);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_628,"Using texture swizzle ",0x16);
  if ((this->m_textureSwizzle).m_isSome == true) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_628,"(",1);
    anon_unknown_0::operator<<((ostream *)&local_628,(this->m_textureSwizzle).m_swizzle.m_data[0]);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_628,", ",2);
    anon_unknown_0::operator<<((ostream *)&local_628,(this->m_textureSwizzle).m_swizzle.m_data[1]);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_628,", ",2);
    anon_unknown_0::operator<<((ostream *)&local_628,(this->m_textureSwizzle).m_swizzle.m_data[2]);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_628,", ",2);
    anon_unknown_0::operator<<((ostream *)&local_628,(this->m_textureSwizzle).m_swizzle.m_data[3]);
    lVar14 = 1;
    pcVar9 = ")";
  }
  else {
    lVar14 = 0x17;
    pcVar9 = "[default swizzle state]";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_628,pcVar9,lVar14);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_630,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_628);
  std::ios_base::~ios_base(local_5b8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_4a8);
  std::ios_base::~ios_base(local_438);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_328);
  std::ios_base::~ios_base(local_2b8);
  std::__cxx11::ostringstream::~ostringstream(this_02);
  iVar5 = std::ios_base::~ios_base(local_138);
  if (this->m_shadowCompareMode != COMPAREMODE_NONE) {
    local_630 = (undefined1  [8])this_03;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_628);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_628,"Using texture compare func ",0x1b);
    dVar6 = glu::getGLCompareFunc(this->m_shadowCompareMode);
    pcVar9 = glu::getCompareFuncName(dVar6);
    if (pcVar9 == (char *)0x0) {
      std::ios::clear((int)local_628[-3] + (int)(ostringstream *)&local_628);
    }
    else {
      sVar10 = strlen(pcVar9);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_628,pcVar9,sVar10);
    }
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_630,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_628);
    iVar5 = std::ios_base::~ios_base(local_5b8);
  }
  return iVar5;
}

Assistant:

void TextureGatherCase::init (void)
{
	TestLog&					log				= m_testCtx.getLog();
	const glu::RenderContext&	renderCtx		= m_context.getRenderContext();
	const glw::Functions&		gl				= renderCtx.getFunctions();
	const deUint32				texTypeGL		= getGLTextureType(m_textureType);
	const bool					supportsES32	= glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::es(3, 2));

	// Check prerequisites.
	if (requireGpuShader5(m_gatherType) && !supportsES32 && !m_context.getContextInfo().isExtensionSupported("GL_EXT_gpu_shader5"))
		throw tcu::NotSupportedError("GL_EXT_gpu_shader5 required");

	// Log and check implementation offset limits, if appropriate.
	if (m_offsetSize == OFFSETSIZE_IMPLEMENTATION_MAXIMUM)
	{
		const IVec2 offsetRange = getOffsetRange();
		log << TestLog::Integer("ImplementationMinTextureGatherOffset", "Implementation's value for GL_MIN_PROGRAM_TEXTURE_GATHER_OFFSET", "", QP_KEY_TAG_NONE, offsetRange[0])
			<< TestLog::Integer("ImplementationMaxTextureGatherOffset", "Implementation's value for GL_MAX_PROGRAM_TEXTURE_GATHER_OFFSET", "", QP_KEY_TAG_NONE, offsetRange[1]);
		TCU_CHECK_MSG(offsetRange[0] <= SPEC_MAX_MIN_OFFSET, ("GL_MIN_PROGRAM_TEXTURE_GATHER_OFFSET must be at most " + de::toString((int)SPEC_MAX_MIN_OFFSET)).c_str());
		TCU_CHECK_MSG(offsetRange[1] >= SPEC_MIN_MAX_OFFSET, ("GL_MAX_PROGRAM_TEXTURE_GATHER_OFFSET must be at least " + de::toString((int)SPEC_MIN_MAX_OFFSET)).c_str());
	}

	// Create rbo and fbo.

	m_colorBuffer = MovePtr<glu::Renderbuffer>(new glu::Renderbuffer(renderCtx));
	gl.bindRenderbuffer(GL_RENDERBUFFER, **m_colorBuffer);
	gl.renderbufferStorage(GL_RENDERBUFFER, glu::getInternalFormat(m_colorBufferFormat), RENDER_SIZE.x(), RENDER_SIZE.y());
	GLU_EXPECT_NO_ERROR(gl.getError(), "Create and setup renderbuffer object");

	m_fbo = MovePtr<glu::Framebuffer>(new glu::Framebuffer(renderCtx));
	gl.bindFramebuffer(GL_FRAMEBUFFER, **m_fbo);
	gl.framebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, **m_colorBuffer);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Create and setup framebuffer object");

	log << TestLog::Message << "Using a framebuffer object with renderbuffer with format "
							<< glu::getTextureFormatName(glu::getInternalFormat(m_colorBufferFormat))
							<< " and size " << RENDER_SIZE << TestLog::EndMessage;

	// Generate subclass-specific iterations.

	generateIterations();
	m_currentIteration = 0;

	// Initialize texture.

	createAndUploadTexture();
	gl.texParameteri(texTypeGL, GL_TEXTURE_WRAP_S,		glu::getGLWrapMode(m_wrapS));
	gl.texParameteri(texTypeGL, GL_TEXTURE_WRAP_T,		glu::getGLWrapMode(m_wrapT));
	gl.texParameteri(texTypeGL, GL_TEXTURE_MIN_FILTER,	glu::getGLFilterMode(m_minFilter));
	gl.texParameteri(texTypeGL, GL_TEXTURE_MAG_FILTER,	glu::getGLFilterMode(m_magFilter));

	if (m_baseLevel != 0)
		gl.texParameteri(texTypeGL, GL_TEXTURE_BASE_LEVEL, m_baseLevel);

	if (isDepthFormat(m_textureFormat))
	{
		gl.texParameteri(texTypeGL, GL_TEXTURE_COMPARE_MODE, GL_COMPARE_REF_TO_TEXTURE);
		gl.texParameteri(texTypeGL, GL_TEXTURE_COMPARE_FUNC, glu::getGLCompareFunc(m_shadowCompareMode));
	}

	if (m_textureSwizzle.isSome())
	{
		const deUint32 swizzleNamesGL[4] =
		{
			GL_TEXTURE_SWIZZLE_R,
			GL_TEXTURE_SWIZZLE_G,
			GL_TEXTURE_SWIZZLE_B,
			GL_TEXTURE_SWIZZLE_A
		};

		for (int i = 0; i < 4; i++)
		{
			const deUint32 curGLSwizzle = getGLTextureSwizzleComponent(m_textureSwizzle.getSwizzle()[i]);
			gl.texParameteri(texTypeGL, swizzleNamesGL[i], curGLSwizzle);
		}
	}

	GLU_EXPECT_NO_ERROR(gl.getError(), "Set texture parameters");

	log << TestLog::Message << "Texture base level is " << m_baseLevel << TestLog::EndMessage
		<< TestLog::Message << "s and t wrap modes are "
							<< glu::getTextureWrapModeName(glu::getGLWrapMode(m_wrapS)) << " and "
							<< glu::getTextureWrapModeName(glu::getGLWrapMode(m_wrapT)) << ", respectively" << TestLog::EndMessage
		<< TestLog::Message << "Minification and magnification filter modes are "
							<< glu::getTextureFilterName(glu::getGLFilterMode(m_minFilter)) << " and "
							<< glu::getTextureFilterName(glu::getGLFilterMode(m_magFilter)) << ", respectively "
							<< ((m_flags & GATHERCASE_MIPMAP_INCOMPLETE) ?
								"(note that they cause the texture to be incomplete)" :
								"(note that they should have no effect on gather result)")
							<< TestLog::EndMessage
		<< TestLog::Message << "Using texture swizzle " << m_textureSwizzle << TestLog::EndMessage;

	if (m_shadowCompareMode != tcu::Sampler::COMPAREMODE_NONE)
		log << TestLog::Message << "Using texture compare func " << glu::getCompareFuncName(glu::getGLCompareFunc(m_shadowCompareMode)) << TestLog::EndMessage;
}